

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<BindEntry>::cleanup(SmallVectorBase<BindEntry> *this,EVP_PKEY_CTX *ctx)

{
  pointer p;
  pointer pBVar1;
  pointer pBVar2;
  
  if (this->len != 0) {
    pBVar2 = this->data_;
    pBVar1 = pBVar2 + this->len;
    do {
      p = (pBVar2->path).entries.super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.data_;
      if (p != (pointer)(pBVar2->path).entries.
                        super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.firstElement) {
        operator_delete(p);
      }
      pBVar2 = pBVar2 + 1;
    } while (pBVar2 != pBVar1);
  }
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }